

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

ssize_t __thiscall xs::TestMessage::write(TestMessage *this,int __fd,void *__buf,size_t __n)

{
  char *value;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  MessageWriter local_20;
  MessageWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buf_local;
  TestMessage *this_local;
  
  writer.m_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_register_00000034,__fd);
  MessageWriter::MessageWriter(&local_20,(this->super_Message).type,writer.m_buf);
  value = (char *)std::__cxx11::string::c_str();
  MessageWriter::put<char_const*>(&local_20,value);
  MessageWriter::~MessageWriter(&local_20);
  return extraout_RAX;
}

Assistant:

void TestMessage::write (vector<deUint8>& buf) const
{
	MessageWriter writer(type, buf);
	writer.put(test.c_str());
}